

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_pipeline
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  Layer *pLVar3;
  undefined8 *puVar4;
  byte *in_RSI;
  long in_RDI;
  Mat weight_data_r2_2;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_00000550;
  ConvolutionDepthWise_x86_avx512 *in_stack_00000558;
  Option *in_stack_fffffffffffffd28;
  undefined8 *puVar5;
  int in_stack_fffffffffffffd34;
  Mat *in_stack_fffffffffffffd38;
  void **ppvVar6;
  Mat *in_stack_fffffffffffffd40;
  Mat *src;
  int local_284;
  int local_280;
  void *local_270;
  Option *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  Mat *in_stack_fffffffffffffda8;
  Option *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc4;
  void *local_228;
  int *local_220;
  undefined8 local_218;
  undefined4 local_210;
  long *local_208;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined8 local_1e8;
  void *local_1d0;
  int *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  long *local_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined8 local_190;
  int local_184;
  int local_180;
  int local_17c;
  byte *local_178;
  int local_164;
  void **local_160;
  void **local_150;
  void **local_140;
  int local_130;
  undefined4 local_12c;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  int local_110;
  undefined4 local_10c;
  undefined8 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  int local_f0;
  undefined4 local_ec;
  undefined8 *local_e8;
  int local_e0;
  undefined4 local_dc;
  undefined8 *local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  int local_80;
  undefined4 local_7c;
  void **local_78;
  int local_70;
  undefined4 local_6c;
  undefined8 *local_68;
  int local_60;
  undefined4 local_5c;
  undefined8 *local_58;
  void *local_50;
  void *local_48;
  void *local_10;
  void *local_8;
  
  if (*(int *)(in_RDI + 0x160) == 0) {
    local_178 = in_RSI;
    pLVar3 = create_activation_layer
                       (in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8,
                        in_stack_fffffffffffffdb0);
    *(Layer **)(in_RDI + 0x2d0) = pLVar3;
    if (((local_178[0x1e] & 1) == 0) || (*(long *)(in_RDI + 0x178) != 1)) {
      local_17c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
      uVar2 = (long)*(int *)(in_RDI + 0x104) / (long)*(int *)(in_RDI + 0x108);
      local_180 = ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                        (long)local_17c) / (*(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x108))) *
                  *(int *)(in_RDI + 0x108);
      if ((local_180 == *(int *)(in_RDI + 0x108)) &&
         (*(int *)(in_RDI + 0x108) == *(int *)(in_RDI + 0xd0))) {
        local_184 = 1;
        if ((local_178[0x27] & 1) != 0) {
          if (local_180 % 0x10 == 0) {
            local_280 = 0x10;
          }
          else {
            if (local_180 % 8 == 0) {
              local_284 = 8;
            }
            else {
              local_284 = 1;
              if (local_180 % 4 == 0) {
                local_284 = 4;
              }
            }
            local_280 = local_284;
          }
          local_184 = local_280;
        }
        if (local_184 == 0x10) {
          Mat::reshape(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0
                       ,(Allocator *)in_stack_fffffffffffffd98);
          convert_packing(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd34,in_stack_fffffffffffffd28);
          local_160 = &local_1d0;
          local_78 = local_160;
          if (local_1c8 != (int *)0x0) {
            local_7c = 0xffffffff;
            LOCK();
            local_80 = *local_1c8;
            *local_1c8 = *local_1c8 + -1;
            UNLOCK();
            if (local_80 == 1) {
              if (local_1b0 == (long *)0x0) {
                if (local_1d0 != (void *)0x0) {
                  free(local_1d0);
                }
              }
              else {
                (**(code **)(*local_1b0 + 0x18))(local_1b0,local_1d0);
              }
            }
          }
          local_1d0 = (void *)0x0;
          local_1c0 = 0;
          local_1b8 = 0;
          local_1a8 = 0;
          local_1a4 = 0;
          local_1a0 = 0;
          local_19c = 0;
          local_198 = 0;
          local_190 = 0;
          local_1c8 = (int *)0x0;
        }
        if (local_184 == 8) {
          Mat::reshape(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0
                       ,(Allocator *)in_stack_fffffffffffffd98);
          convert_packing(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd34,in_stack_fffffffffffffd28);
          local_150 = &local_228;
          local_98 = local_150;
          if (local_220 != (int *)0x0) {
            local_9c = 0xffffffff;
            LOCK();
            local_a0 = *local_220;
            *local_220 = *local_220 + -1;
            UNLOCK();
            if (local_a0 == 1) {
              if (local_208 == (long *)0x0) {
                if (local_228 != (void *)0x0) {
                  free(local_228);
                }
              }
              else {
                (**(code **)(*local_208 + 0x18))(local_208,local_228);
              }
            }
          }
          local_228 = (void *)0x0;
          local_218 = 0;
          local_210 = 0;
          local_200 = 0;
          local_1fc = 0;
          local_1f8 = 0;
          local_1f4 = 0;
          local_1f0 = 0;
          local_1e8 = 0;
          local_220 = (int *)0x0;
        }
        if (local_184 == 4) {
          src = (Mat *)&local_270;
          Mat::reshape(in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,in_stack_fffffffffffffda0
                       ,(Allocator *)in_stack_fffffffffffffd98);
          convert_packing(src,in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                          in_stack_fffffffffffffd28);
          ppvVar6 = &local_270;
          local_140 = ppvVar6;
          local_b8 = ppvVar6;
          if (in_stack_fffffffffffffd98 != (Option *)0x0) {
            local_bc = 0xffffffff;
            LOCK();
            local_c0._0_1_ = in_stack_fffffffffffffd98->lightmode;
            local_c0._1_1_ = in_stack_fffffffffffffd98->use_shader_pack8;
            local_c0._2_1_ = in_stack_fffffffffffffd98->use_subgroup_ops;
            local_c0._3_1_ = in_stack_fffffffffffffd98->use_reserved_0;
            *(int *)in_stack_fffffffffffffd98 = *(int *)in_stack_fffffffffffffd98 + -1;
            UNLOCK();
            if (local_c0 == 1) {
              if (in_stack_fffffffffffffdb0 == (Option *)0x0) {
                if (local_270 != (void *)0x0) {
                  free(local_270);
                }
              }
              else {
                (**(code **)(*(long *)in_stack_fffffffffffffdb0 + 0x18))
                          (in_stack_fffffffffffffdb0,local_270);
              }
            }
          }
          *ppvVar6 = (void *)0x0;
          ppvVar6[2] = (void *)0x0;
          *(undefined4 *)(ppvVar6 + 3) = 0;
          *(undefined4 *)(ppvVar6 + 5) = 0;
          *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
          *(undefined4 *)(ppvVar6 + 6) = 0;
          *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
          *(undefined4 *)(ppvVar6 + 7) = 0;
          ppvVar6[8] = (void *)0x0;
          ppvVar6[1] = (void *)0x0;
        }
        if (local_184 == 1) {
          if ((((*(int *)(in_RDI + 0xd4) == 3) && (*(int *)(in_RDI + 0xd8) == 3)) &&
              (*(int *)(in_RDI + 0xdc) == 1)) &&
             (((*(int *)(in_RDI + 0xe0) == 1 && (*(int *)(in_RDI + 0xe4) == 1)) &&
              (*(int *)(in_RDI + 0xe8) == 1)))) {
            local_108 = (undefined8 *)(in_RDI + 0x168);
            puVar4 = (undefined8 *)(in_RDI + 0x2f0);
            local_100 = puVar4;
            local_f8 = puVar4;
            if (puVar4 != local_108) {
              if (*(long *)(in_RDI + 0x170) != 0) {
                piVar1 = *(int **)(in_RDI + 0x170);
                local_10c = 1;
                LOCK();
                local_110 = *piVar1;
                *piVar1 = *piVar1 + 1;
                UNLOCK();
              }
              puVar5 = puVar4;
              local_e8 = puVar4;
              if (*(long *)(in_RDI + 0x2f8) != 0) {
                piVar1 = *(int **)(in_RDI + 0x2f8);
                local_ec = 0xffffffff;
                LOCK();
                local_f0 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_f0 == 1) {
                  if (*(long *)(in_RDI + 0x310) == 0) {
                    local_8 = (void *)*puVar4;
                    if (local_8 != (void *)0x0) {
                      free(local_8);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x310) + 0x18))
                              (*(long **)(in_RDI + 0x310),*puVar4);
                  }
                }
              }
              *puVar4 = 0;
              *(undefined8 *)(in_RDI + 0x300) = 0;
              *(undefined4 *)(in_RDI + 0x308) = 0;
              *(undefined4 *)(in_RDI + 0x318) = 0;
              *(undefined4 *)(in_RDI + 0x31c) = 0;
              *(undefined4 *)(in_RDI + 800) = 0;
              *(undefined4 *)(in_RDI + 0x324) = 0;
              *(undefined4 *)(in_RDI + 0x328) = 0;
              *(undefined8 *)(in_RDI + 0x330) = 0;
              *(undefined8 *)(in_RDI + 0x2f8) = 0;
              *puVar5 = *local_108;
              puVar5[1] = local_108[1];
              puVar5[2] = local_108[2];
              *(undefined4 *)(puVar5 + 3) = *(undefined4 *)(local_108 + 3);
              puVar5[4] = local_108[4];
              *(undefined4 *)(puVar5 + 5) = *(undefined4 *)(local_108 + 5);
              *(undefined4 *)((long)puVar5 + 0x2c) = *(undefined4 *)((long)local_108 + 0x2c);
              *(undefined4 *)(puVar5 + 6) = *(undefined4 *)(local_108 + 6);
              *(undefined4 *)((long)puVar5 + 0x34) = *(undefined4 *)((long)local_108 + 0x34);
              *(undefined4 *)(puVar5 + 7) = *(undefined4 *)(local_108 + 7);
              puVar5[8] = local_108[8];
              local_f8 = puVar5;
            }
          }
          else if (((*(int *)(in_RDI + 0xd4) == 3) && (*(int *)(in_RDI + 0xd8) == 3)) &&
                  ((*(int *)(in_RDI + 0xdc) == 1 &&
                   (((*(int *)(in_RDI + 0xe0) == 1 && (*(int *)(in_RDI + 0xe4) == 2)) &&
                    (*(int *)(in_RDI + 0xe8) == 2)))))) {
            local_128 = (undefined8 *)(in_RDI + 0x168);
            puVar4 = (undefined8 *)(in_RDI + 0x2f0);
            local_120 = puVar4;
            local_118 = puVar4;
            if (puVar4 != local_128) {
              if (*(long *)(in_RDI + 0x170) != 0) {
                piVar1 = *(int **)(in_RDI + 0x170);
                local_12c = 1;
                LOCK();
                local_130 = *piVar1;
                *piVar1 = *piVar1 + 1;
                UNLOCK();
              }
              local_d8 = puVar4;
              if (*(long *)(in_RDI + 0x2f8) != 0) {
                piVar1 = *(int **)(in_RDI + 0x2f8);
                local_dc = 0xffffffff;
                LOCK();
                local_e0 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_e0 == 1) {
                  if (*(long *)(in_RDI + 0x310) == 0) {
                    local_10 = (void *)*puVar4;
                    if (local_10 != (void *)0x0) {
                      free(local_10);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x310) + 0x18))
                              (*(long **)(in_RDI + 0x310),*puVar4);
                  }
                }
              }
              *puVar4 = 0;
              *(undefined8 *)(in_RDI + 0x300) = 0;
              *(undefined4 *)(in_RDI + 0x308) = 0;
              *(undefined4 *)(in_RDI + 0x318) = 0;
              *(undefined4 *)(in_RDI + 0x31c) = 0;
              *(undefined4 *)(in_RDI + 800) = 0;
              *(undefined4 *)(in_RDI + 0x324) = 0;
              *(undefined4 *)(in_RDI + 0x328) = 0;
              *(undefined8 *)(in_RDI + 0x330) = 0;
              *(undefined8 *)(in_RDI + 0x2f8) = 0;
              *puVar4 = *local_128;
              *(undefined8 *)(in_RDI + 0x2f8) = local_128[1];
              *(undefined8 *)(in_RDI + 0x300) = local_128[2];
              *(undefined4 *)(in_RDI + 0x308) = *(undefined4 *)(local_128 + 3);
              *(undefined8 *)(in_RDI + 0x310) = local_128[4];
              *(undefined4 *)(in_RDI + 0x318) = *(undefined4 *)(local_128 + 5);
              *(undefined4 *)(in_RDI + 0x31c) = *(undefined4 *)((long)local_128 + 0x2c);
              *(undefined4 *)(in_RDI + 800) = *(undefined4 *)(local_128 + 6);
              *(undefined4 *)(in_RDI + 0x324) = *(undefined4 *)((long)local_128 + 0x34);
              *(undefined4 *)(in_RDI + 0x328) = *(undefined4 *)(local_128 + 7);
              *(undefined8 *)(in_RDI + 0x330) = local_128[8];
            }
          }
          else {
            create_group_ops(in_stack_00000558,in_stack_00000550);
          }
        }
        if ((*local_178 & 1) != 0) {
          puVar4 = (undefined8 *)(in_RDI + 0x168);
          if (*(long *)(in_RDI + 0x170) != 0) {
            piVar1 = *(int **)(in_RDI + 0x170);
            local_5c = 0xffffffff;
            LOCK();
            local_60 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_60 == 1) {
              local_58 = puVar4;
              if (*(long *)(in_RDI + 0x188) == 0) {
                local_50 = (void *)*puVar4;
                if (local_50 != (void *)0x0) {
                  free(local_50);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))
                          (*(long **)(in_RDI + 0x188),*puVar4);
              }
            }
          }
          *puVar4 = 0;
          *(undefined8 *)(in_RDI + 0x178) = 0;
          *(undefined4 *)(in_RDI + 0x180) = 0;
          *(undefined4 *)(in_RDI + 400) = 0;
          *(undefined4 *)(in_RDI + 0x194) = 0;
          *(undefined4 *)(in_RDI + 0x198) = 0;
          *(undefined4 *)(in_RDI + 0x19c) = 0;
          *(undefined4 *)(in_RDI + 0x1a0) = 0;
          *(undefined8 *)(in_RDI + 0x1a8) = 0;
          *(undefined8 *)(in_RDI + 0x170) = 0;
        }
        local_164 = 0;
      }
      else {
        create_group_ops(in_stack_00000558,in_stack_00000550);
        if ((*local_178 & 1) != 0) {
          puVar4 = (undefined8 *)(in_RDI + 0x168);
          if (*(long *)(in_RDI + 0x170) != 0) {
            piVar1 = *(int **)(in_RDI + 0x170);
            local_6c = 0xffffffff;
            LOCK();
            local_70 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_70 == 1) {
              local_68 = puVar4;
              if (*(long *)(in_RDI + 0x188) == 0) {
                local_48 = (void *)*puVar4;
                if (local_48 != (void *)0x0) {
                  free(local_48);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x188) + 0x18))
                          (*(long **)(in_RDI + 0x188),*puVar4);
              }
            }
          }
          *puVar4 = 0;
          *(undefined8 *)(in_RDI + 0x178) = 0;
          *(undefined4 *)(in_RDI + 0x180) = 0;
          *(undefined4 *)(in_RDI + 400) = 0;
          *(undefined4 *)(in_RDI + 0x194) = 0;
          *(undefined4 *)(in_RDI + 0x198) = 0;
          *(undefined4 *)(in_RDI + 0x19c) = 0;
          *(undefined4 *)(in_RDI + 0x1a0) = 0;
          *(undefined8 *)(in_RDI + 0x1a8) = 0;
          *(undefined8 *)(in_RDI + 0x170) = 0;
        }
        local_164 = 0;
      }
    }
    else {
      local_164 = create_pipeline_int8_x86
                            ((ConvolutionDepthWise_x86_avx512 *)
                             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                             in_stack_fffffffffffffd98);
    }
  }
  else {
    local_164 = 0;
  }
  return local_164;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}